

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreFilter.hpp
# Opt level: O0

void __thiscall
cppjieba::PreFilter::PreFilter
          (PreFilter *this,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *symbols,string *sentence)

{
  bool bVar1;
  ostream *poVar2;
  const_iterator pRVar3;
  Logger local_1b0;
  string *local_20;
  string *sentence_local;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *symbols_local;
  PreFilter *this_local;
  
  local_20 = sentence;
  sentence_local = (string *)symbols;
  symbols_local =
       (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        *)this;
  limonp::LocalVector<cppjieba::RuneStr>::LocalVector(&this->sentence_);
  this->symbols_ =
       (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
        *)sentence_local;
  bVar1 = DecodeRunesInString(local_20,&this->sentence_);
  if (!bVar1) {
    limonp::Logger::Logger
              (&local_1b0,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/PreFilter.hpp"
               ,0x15);
    poVar2 = limonp::Logger::Stream(&local_1b0);
    std::operator<<(poVar2,"decode failed. ");
    limonp::Logger::~Logger(&local_1b0);
  }
  pRVar3 = limonp::LocalVector<cppjieba::RuneStr>::begin(&this->sentence_);
  this->cursor_ = pRVar3;
  return;
}

Assistant:

PreFilter(const unordered_set<Rune>& symbols, 
        const string& sentence)
    : symbols_(symbols) {
    if (!DecodeRunesInString(sentence, sentence_)) {
      XLOG(ERROR) << "decode failed. "; 
    }
    cursor_ = sentence_.begin();
  }